

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,true,false>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  interval_t upper;
  interval_t input;
  interval_t lower;
  bool bVar1;
  int64_t unaff_RBX;
  idx_t iVar2;
  undefined8 unaff_R12;
  int64_t unaff_R13;
  idx_t iVar3;
  idx_t i;
  idx_t iVar4;
  
  iVar2 = 0;
  for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
    iVar3 = iVar4;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar3 = (idx_t)result_sel->sel_vector[iVar4];
    }
    input.micros = unaff_RBX;
    input.months = (int)count;
    input.days = (int)(count >> 0x20);
    lower.micros = unaff_R13;
    lower.months = (int)unaff_R12;
    lower.days = (int)((ulong)unaff_R12 >> 0x20);
    upper.micros = (int64_t)asel;
    upper._0_8_ = result_sel;
    bVar1 = LowerInclusiveBetweenOperator::Operation<duckdb::interval_t>(input,lower,upper);
    true_sel->sel_vector[iVar2] = (sel_t)iVar3;
    iVar2 = iVar2 + bVar1;
  }
  return iVar2;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}